

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_bnd_jmp(DisasContext *s)

{
  TCGContext *tcg_ctx_00;
  TCGContext *tcg_ctx;
  DisasContext *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if ((((s->prefix & 2U) == 0) && ((s->flags & 0x2000000) != 0)) && ((s->flags & 0x4000000) != 0)) {
    gen_helper_bnd_jmp(tcg_ctx_00,tcg_ctx_00->cpu_env);
  }
  return;
}

Assistant:

static void gen_bnd_jmp(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    /* Clear the registers only if BND prefix is missing, MPX is enabled,
       and if the BNDREGs are known to be in use (non-zero) already.
       The helper itself will check BNDPRESERVE at runtime.  */
    if ((s->prefix & PREFIX_REPNZ) == 0
        && (s->flags & HF_MPX_EN_MASK) != 0
        && (s->flags & HF_MPX_IU_MASK) != 0) {
        gen_helper_bnd_jmp(tcg_ctx, tcg_ctx->cpu_env);
    }
}